

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O1

string * __thiscall
HammeringPattern::get_agg_access_pairs_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,HammeringPattern *this)

{
  _func_int *p_Var1;
  string *psVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  pointer this_00;
  stringstream local_1e8 [8];
  stringstream ss;
  undefined1 local_1d8 [24];
  undefined1 auStack_1c0 [88];
  ios_base local_168 [112];
  char acStack_f8 [152];
  pointer local_60;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1e8);
  this_00 = (this->agg_access_patterns).
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->agg_access_patterns).
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_60) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      cVar3 = (char)(ostream *)local_1d8;
      if ((iVar4 != 0) && ((int)(uVar5 / 3) * -3 == iVar4)) {
        std::ios::widen((char)*(_func_int **)(local_1d8._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      *(undefined8 *)(*(_func_int **)(local_1d8._0_8_ + -0x18) + (long)(local_1d8 + 0x10)) = 0x1e;
      p_Var1 = *(_func_int **)(local_1d8._0_8_ + -0x18);
      if ((acStack_f8 + 1)[(long)p_Var1] == '\0') {
        cVar3 = std::ios::widen(cVar3 + (char)p_Var1);
        acStack_f8[(long)p_Var1] = cVar3;
        (acStack_f8 + 1)[(long)p_Var1] = '\x01';
      }
      acStack_f8[(long)p_Var1] = ' ';
      *(uint *)(*(_func_int **)(local_1d8._0_8_ + -0x18) + (long)(local_1d8 + 0x18)) =
           *(uint *)(*(_func_int **)(local_1d8._0_8_ + -0x18) + (long)(local_1d8 + 0x18)) &
           0xffffff4f | 0x20;
      AggressorAccessPattern::to_string_abi_cxx11_(&local_50,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      this_00 = this_00 + 1;
      iVar4 = iVar4 + -1;
    } while (this_00 != local_60);
  }
  psVar2 = local_58;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1d8 + 0x70));
  return psVar2;
}

Assistant:

std::string HammeringPattern::get_agg_access_pairs_text_repr() {
  std::stringstream ss;
  auto cnt = 0;
  for (const auto &agg_acc_pair : agg_access_patterns) {
    // add a new line after each three aggressor access patterns to avoid unintended text wrapping in terminal
    if (cnt > 0 && cnt%3==0) ss << std::endl;
    ss << std::setw(30) << std::setfill(' ') << std::left << agg_acc_pair.to_string();
    cnt++;
  }
  return ss.str();
}